

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_5::RepeatedVarint_SInt64_Test::TestBody
          (RepeatedVarint_SInt64_Test *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference plVar4;
  size_t sVar5;
  char *message;
  AssertHelper local_70;
  Message local_68;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  unsigned_long uStack_40;
  int i;
  size_t expected;
  int local_24;
  undefined1 local_20 [4];
  int n;
  RepeatedField<long> v;
  RepeatedVarint_SInt64_Test *this_local;
  
  v.soo_rep_.field_0.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)this;
  RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_20);
  for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
    RepeatedField<long>::Add((RepeatedField<long> *)local_20,(long)-(1 << ((byte)local_24 & 0x1f)));
    RepeatedField<long>::Add((RepeatedField<long> *)local_20,(long)(1 << ((byte)local_24 & 0x1f)));
    RepeatedField<long>::Add
              ((RepeatedField<long> *)local_20,(long)((1 << ((byte)local_24 & 0x1f)) + -1));
  }
  uStack_40 = 0;
  for (gtest_ar.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl._4_4_ = 0;
      iVar1 = gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_,
      iVar3 = RepeatedField<long>::size((RepeatedField<long> *)local_20), iVar1 < iVar3;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ =
           gtest_ar.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl._4_4_ + 1) {
    plVar4 = RepeatedField<long>::operator[]
                       ((RepeatedField<long> *)local_20,
                        gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_);
    sVar5 = WireFormatLite::SInt64Size(*plVar4);
    uStack_40 = sVar5 + uStack_40;
  }
  local_60 = WireFormatLite::SInt64Size((RepeatedField<long> *)local_20);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_58,"expected","WireFormatLite::SInt64Size(v)",
             &stack0xffffffffffffffc0,&local_60);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(&local_68);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.cc"
               ,0x6f,message);
    testing::internal::AssertHelper::operator=(&local_70,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::Message::~Message(&local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  RepeatedField<long>::~RepeatedField((RepeatedField<long> *)local_20);
  return;
}

Assistant:

TEST(RepeatedVarint, SInt64) {
  RepeatedField<int64_t> v;

  // Insert -2^n, 2^n and 2^n-1.
  for (int n = 0; n < 10; n++) {
    v.Add(-(1 << n));
    v.Add(1 << n);
    v.Add((1 << n) - 1);
  }

  // Check consistency with the scalar SInt64Size.
  size_t expected = 0;
  for (int i = 0; i < v.size(); i++) {
    expected += WireFormatLite::SInt64Size(v[i]);
  }

  EXPECT_EQ(expected, WireFormatLite::SInt64Size(v));
}